

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void textfile_bang(t_qlist *x)

{
  int iVar1;
  _outlet *x_00;
  uint uVar2;
  t_atom *ptVar3;
  t_atom *ptVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar2 = binbuf_getnatom((x->x_textbuf).b_binbuf);
  iVar1 = x->x_onset;
  uVar8 = (ulong)iVar1;
  ptVar3 = binbuf_getvec((x->x_textbuf).b_binbuf);
  ptVar3 = ptVar3 + uVar8;
  if (iVar1 < (int)uVar2) {
    do {
      if ((ptVar3->a_type & ~A_FLOAT) != A_SEMI) goto LAB_0018f02d;
      uVar6 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar6;
      ptVar3 = ptVar3 + 1;
    } while (uVar2 != uVar6);
    uVar8 = (ulong)uVar2;
  }
LAB_0018f02d:
  uVar7 = (uint)uVar8;
  uVar6 = uVar7;
  if ((int)uVar7 < (int)uVar2) {
    uVar8 = uVar8 & 0xffffffff;
    ptVar4 = ptVar3;
    do {
      uVar6 = (uint)uVar8;
      if ((ptVar4->a_type & ~A_FLOAT) == A_SEMI) break;
      uVar5 = (uint)uVar8 + 1;
      uVar8 = (ulong)uVar5;
      ptVar4 = ptVar4 + 1;
      uVar6 = uVar2;
    } while (uVar2 != uVar5);
  }
  if (uVar6 - uVar7 == 0 || (int)uVar6 < (int)uVar7) {
    x->x_onset = 0x7fffffff;
    outlet_bang(x->x_bangout);
    return;
  }
  x->x_onset = uVar6;
  x_00 = (x->x_textbuf).b_ob.te_outlet;
  if (ptVar3->a_type != A_SYMBOL) {
    outlet_list(x_00,(t_symbol *)0x0,uVar6 - uVar7,ptVar3);
    return;
  }
  outlet_anything(x_00,(ptVar3->a_w).w_symbol,uVar6 + ~uVar7,ptVar3 + 1);
  return;
}

Assistant:

static void textfile_bang(t_qlist *x)
{
    int argc = binbuf_getnatom(x->x_binbuf),
        onset = x->x_onset, onset2;
    t_atom *argv = binbuf_getvec(x->x_binbuf);
    t_atom *ap = argv + onset, *ap2;
    while (onset < argc &&
        (ap->a_type == A_SEMI || ap->a_type == A_COMMA))
            onset++, ap++;
    onset2 = onset;
    ap2 = ap;
    while (onset2 < argc &&
        (ap2->a_type != A_SEMI && ap2->a_type != A_COMMA))
            onset2++, ap2++;
    if (onset2 > onset)
    {
        x->x_onset = onset2;
        if (ap->a_type == A_SYMBOL)
            outlet_anything(x->x_ob.ob_outlet, ap->a_w.w_symbol,
                onset2-onset-1, ap+1);
        else outlet_list(x->x_ob.ob_outlet, 0, onset2-onset, ap);
    }
    else
    {
        x->x_onset = 0x7fffffff;
        outlet_bang(x->x_bangout);
    }
}